

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ObjAddFanin(Emb_Obj_t *pObj,Emb_Obj_t *pFanin)

{
  uint uVar1;
  int iVar2;
  Emb_Obj_t *pFanin_local;
  Emb_Obj_t *pObj_local;
  
  if (*(uint *)pObj >> 4 <= (pObj->field_7).TravId) {
    __assert_fail("pObj->iFanin < pObj->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x9b,"void Emb_ObjAddFanin(Emb_Obj_t *, Emb_Obj_t *)");
  }
  if ((pFanin->field_8).Value < pFanin->nFanouts) {
    iVar2 = pObj->hHandle - pFanin->hHandle;
    uVar1 = (pObj->field_7).TravId;
    (pObj->field_7).TravId = uVar1 + 1;
    *(int *)(&pObj[1].field_0x0 + (ulong)uVar1 * 4) = iVar2;
    uVar1 = (pFanin->field_8).Value;
    (pFanin->field_8).Value = uVar1 + 1;
    *(int *)(&pFanin[1].field_0x0 + (ulong)((*(uint *)pFanin >> 4) + uVar1) * 4) = iVar2;
    return;
  }
  __assert_fail("pFanin->iFanout < pFanin->nFanouts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                ,0x9c,"void Emb_ObjAddFanin(Emb_Obj_t *, Emb_Obj_t *)");
}

Assistant:

void Emb_ObjAddFanin( Emb_Obj_t * pObj, Emb_Obj_t * pFanin )
{ 
    assert( pObj->iFanin < pObj->nFanins );
    assert( pFanin->iFanout < pFanin->nFanouts );
    pFanin->Fanios[pFanin->nFanins + pFanin->iFanout++] = 
    pObj->Fanios[pObj->iFanin++] = pObj->hHandle - pFanin->hHandle;
}